

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImpl.cpp
# Opt level: O2

void __thiscall sf::priv::WindowImpl::processSensorEvents(WindowImpl *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  SensorManager *pSVar5;
  float *pfVar6;
  Type sensor;
  long lVar7;
  float fVar8;
  Vector3f VVar9;
  value_type local_34;
  
  pSVar5 = SensorManager::getInstance();
  SensorManager::update(pSVar5);
  pfVar6 = &this->m_sensorValue[0].z;
  lVar7 = 0;
  do {
    if (lVar7 == 6) {
      return;
    }
    pSVar5 = SensorManager::getInstance();
    sensor = (Type)lVar7;
    bVar4 = SensorManager::isEnabled(pSVar5,sensor);
    if (bVar4) {
      fVar1 = ((Vector3f *)(pfVar6 + -2))->x;
      fVar2 = pfVar6[-1];
      fVar3 = *pfVar6;
      pSVar5 = SensorManager::getInstance();
      VVar9 = SensorManager::getValue(pSVar5,sensor);
      fVar8 = VVar9.z;
      ((Vector3f *)(pfVar6 + -2))->x = (float)(int)VVar9._0_8_;
      ((Vector3f *)(pfVar6 + -2))->y = (float)(int)((ulong)VVar9._0_8_ >> 0x20);
      *pfVar6 = fVar8;
      if ((fVar1 == VVar9.x) && (!NAN(fVar1) && !NAN(VVar9.x))) {
        if ((VVar9.y == fVar2) && (!NAN(VVar9.y) && !NAN(fVar2))) {
          if ((fVar8 == fVar3) && (!NAN(fVar8) && !NAN(fVar3))) goto LAB_00114b1e;
        }
      }
      local_34.type = SensorChanged;
      local_34.field_1.sensor.type = sensor;
      local_34.field_1._4_12_ = (undefined1  [12])VVar9;
      std::deque<sf::Event,_std::allocator<sf::Event>_>::push_back(&(this->m_events).c,&local_34);
    }
LAB_00114b1e:
    lVar7 = lVar7 + 1;
    pfVar6 = pfVar6 + 3;
  } while( true );
}

Assistant:

void WindowImpl::processSensorEvents()
{
    // First update the sensor states
    SensorManager::getInstance().update();

    for (unsigned int i = 0; i < Sensor::Count; ++i)
    {
        Sensor::Type sensor = static_cast<Sensor::Type>(i);

        // Only process enabled sensors
        if (SensorManager::getInstance().isEnabled(sensor))
        {
            // Copy the previous value of the sensor and get the new one
            Vector3f previousValue = m_sensorValue[i];
            m_sensorValue[i] = SensorManager::getInstance().getValue(sensor);

            // If the value has changed, trigger an event
            if (m_sensorValue[i] != previousValue) // @todo use a threshold?
            {
                Event event;
                event.type = Event::SensorChanged;
                event.sensor.type = sensor;
                event.sensor.x = m_sensorValue[i].x;
                event.sensor.y = m_sensorValue[i].y;
                event.sensor.z = m_sensorValue[i].z;
                pushEvent(event);
            }
        }
    }
}